

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.cpp
# Opt level: O1

void __thiscall Dijkstra::run(Dijkstra *this)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  pointer pvVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  pointer ptVar9;
  ostream *poVar10;
  pointer piVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  *this_00;
  ulong uVar15;
  tuple initial;
  vector<bool,_std::allocator<bool>_> vis;
  allocator_type local_dd;
  uint local_dc;
  ulong local_d8;
  uint local_cc;
  ulong local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  pointer piStack_b0;
  _Bit_type *local_a8;
  uint uStack_a0;
  undefined4 uStack_9c;
  _Bit_pointer local_98;
  vector<bool,_std::allocator<bool>_> local_90;
  ulong local_68;
  long local_60;
  ulong local_58;
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  *local_50;
  ulong local_48;
  long local_40;
  long local_38;
  
  ptVar9 = (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>._M_impl
           .super__Vector_impl_data._M_start;
  (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (ptVar9 != (pointer)0x0) {
    operator_delete(ptVar9);
  }
  local_b8 = (undefined1  [8])((ulong)local_b8 & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_90,(long)this->nb_nodes,(bool *)local_b8,(allocator_type *)&local_dc);
  local_dc = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_b8,(long)this->nb_nodes,
             (value_type_conflict1 *)&local_dc,&local_dd);
  piVar11 = (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_b8;
  (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piStack_b0;
  (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_a8;
  local_b8._0_4_ = 0;
  local_b8._4_4_ = 0;
  piStack_b0 = (pointer)0x0;
  local_a8 = (_Bit_type *)0x0;
  if (piVar11 != (pointer)0x0) {
    operator_delete(piVar11);
  }
  if ((value_type)local_b8 != (value_type)0x0) {
    operator_delete((void *)local_b8);
  }
  local_dc = local_dc & 0xffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_b8,(long)this->nb_nodes,(bool *)&local_dc,
             (allocator_type *)&local_dd);
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->has_kids).super__Bvector_base<std::allocator<bool>_>);
  (this->has_kids).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_98;
  (this->has_kids).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = local_a8;
  *(ulong *)&(this->has_kids).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset =
       CONCAT44(uStack_9c,uStack_a0);
  (this->has_kids).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)local_b8;
  *(pointer *)
   &(this->has_kids).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = piStack_b0;
  piStack_b0 = (pointer)((ulong)piStack_b0 & 0xffffffff00000000);
  local_a8 = (_Bit_type *)0x0;
  uStack_a0 = 0;
  local_dc = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_b8,(long)this->nb_nodes,
             (value_type_conflict1 *)&local_dc,&local_dd);
  piVar11 = (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_b8;
  (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piStack_b0;
  (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_a8;
  local_b8._0_4_ = 0;
  local_b8._4_4_ = 0;
  piStack_b0 = (pointer)0x0;
  local_a8 = (_Bit_type *)0x0;
  if (piVar11 != (pointer)0x0) {
    operator_delete(piVar11);
  }
  if ((value_type)local_b8 != (value_type)0x0) {
    operator_delete((void *)local_b8);
  }
  (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[this->source] = this->source;
  iVar7 = (*this->_vptr_Dijkstra[9])(this,(ulong)(uint)this->source);
  this_00 = &this->q;
  piVar11 = (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  piVar11[this->source] = iVar7;
  local_b8._4_4_ = piVar11[this->source];
  local_b8._0_4_ = this->source;
  std::
  priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
  ::push(this_00,(value_type *)local_b8);
  if (this->verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"START",5);
    local_dc = CONCAT31(local_dc._1_3_,10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)&local_dc,1);
  }
  ptVar9 = (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((ptVar9 != (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>.
                 _M_impl.super__Vector_impl_data._M_finish) && (0 < this->nb_nodes)) {
    uVar12 = 0;
    local_58 = 0x800000000000003f;
    local_50 = this_00;
    do {
      uVar2 = ptVar9->node;
      std::
      priority_queue<Dijkstra::tuple,_std::vector<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>,_Dijkstra::Priority>
      ::pop(this_00);
      uVar13 = (ulong)(int)uVar2;
      uVar14 = uVar13 + 0x3f;
      if (-1 < (long)uVar13) {
        uVar14 = uVar13;
      }
      uVar15 = (ulong)((uVar13 & local_58) < 0x8000000000000001);
      if ((local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[((long)uVar14 >> 6) + (uVar15 - 1)] >>
           (uVar13 & 0x3f) & 1) == 0) {
        local_d8 = uVar13;
        local_68 = 1L << ((byte)uVar2 & 0x3f);
        local_60 = ((long)uVar14 >> 6) * 8;
        (*this->_vptr_Dijkstra[3])(this,(ulong)uVar2);
        local_40 = uVar15 * 8 + -8;
        puVar1 = (ulong *)((long)local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                          local_40 + local_60);
        *puVar1 = *puVar1 | local_68;
        if (this->verbose == true) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Visiting ",9);
          poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10," from ",6);
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_d8]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(cost: ",7);
          poVar10 = (ostream *)
                    std::ostream::operator<<
                              ((ostream *)poVar10,
                               (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start[local_d8]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
          local_dc = CONCAT31(local_dc._1_3_,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_dc,1);
        }
        uVar12 = (ulong)((int)uVar12 + 1);
        pvVar5 = (this->out).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_38 = local_d8 * 3;
        piVar11 = pvVar5[local_d8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (pvVar5[local_d8].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish != piVar11) {
          uVar14 = 0;
          uVar13 = 1;
          local_cc = uVar2;
          local_48 = uVar12;
          do {
            uVar2 = piVar11[uVar14];
            iVar7 = (*this->_vptr_Dijkstra[4])(this,(ulong)uVar2);
            if (((char)iVar7 == '\0') &&
               (iVar7 = (*this->_vptr_Dijkstra[8])(this,(ulong)uVar2,0xffffffff), -1 < iVar7)) {
              uVar3 = *(uint *)(*(long *)&(this->en).
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data + 4);
              iVar7 = (*this->_vptr_Dijkstra[6])(this,(ulong)uVar3);
              if ((char)iVar7 == '\0') {
                uVar14 = (ulong)(int)uVar3;
                uVar12 = uVar14 + 0x3f;
                if (-1 < (long)uVar14) {
                  uVar12 = uVar14;
                }
                if ((local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     [((long)uVar12 >> 6) + ((ulong)((uVar14 & local_58) < 0x8000000000000001) - 1)]
                     >> (uVar14 & 0x3f) & 1) == 0) {
                  piVar11 = (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  iVar7 = piVar11[uVar14];
                  local_c8 = uVar14;
                  if (iVar7 != -1) {
                    uVar4 = piVar11[local_d8];
                    local_bc = iVar7;
                    iVar7 = (*this->_vptr_Dijkstra[8])(this,(ulong)uVar2,(ulong)uVar4);
                    iVar8 = (*this->_vptr_Dijkstra[9])(this,(ulong)uVar3);
                    if (local_bc <= (int)(iVar7 + uVar4 + iVar8)) goto LAB_001c6e83;
                  }
                  uVar4 = (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[local_d8];
                  iVar7 = (*this->_vptr_Dijkstra[8])(this,(ulong)uVar2,(ulong)uVar4);
                  iVar8 = (*this->_vptr_Dijkstra[9])(this,(ulong)uVar3);
                  (this->cost).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_c8] = iVar7 + uVar4 + iVar8;
                  (this->pred).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[local_c8] = local_cc;
                  puVar1 = (ulong *)((long)(this->has_kids).
                                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                                           super__Bvector_impl_data._M_start.
                                           super__Bit_iterator_base._M_p + local_40 + local_60);
                  *puVar1 = *puVar1 | local_68;
                  if (this->verbose == true) {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"Marked ",7);
                    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10," from ",6);
                    poVar10 = (ostream *)std::ostream::operator<<((ostream *)poVar10,local_cc);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10," of cost ",9);
                    poVar10 = (ostream *)
                              std::ostream::operator<<
                                        ((ostream *)poVar10,
                                         (this->cost).super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[local_c8]);
                    local_dc = CONCAT31(local_dc._1_3_,10);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_dc,1);
                  }
                  (*this->_vptr_Dijkstra[7])
                            (this,CONCAT44((this->cost).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                           super__Vector_impl_data._M_start[local_c8],uVar3));
                }
              }
            }
            else {
              if (this->verbose == true) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"Ignoring edge ",0xe);
                poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar2);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," from ",6);
                poVar10 = (ostream *)
                          std::ostream::operator<<
                                    ((ostream *)poVar10,
                                     *(this->en).
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10," to ",4);
                poVar10 = (ostream *)
                          std::ostream::operator<<
                                    ((ostream *)poVar10,
                                     *(int *)(*(long *)&(this->en).
                                                                                                                
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar2].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 4));
                local_dc = CONCAT31(local_dc._1_3_,10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar10,(char *)&local_dc,1);
              }
              (*this->_vptr_Dijkstra[5])(this,(ulong)uVar2);
            }
LAB_001c6e83:
            pvVar5 = (this->out).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            piVar11 = (&(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start)[local_38];
            bVar6 = uVar13 < (ulong)((long)(&(pvVar5->super__Vector_base<int,_std::allocator<int>_>)
                                             ._M_impl.super__Vector_impl_data._M_finish)[local_38] -
                                     (long)piVar11 >> 2);
            uVar14 = uVar13;
            this_00 = local_50;
            uVar12 = local_48;
            uVar13 = (ulong)((int)uVar13 + 1);
          } while (bVar6);
        }
      }
      ptVar9 = (this->q).c.super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while ((ptVar9 != (this->q).c.
                        super__Vector_base<Dijkstra::tuple,_std::allocator<Dijkstra::tuple>_>.
                        _M_impl.super__Vector_impl_data._M_finish) && ((int)uVar12 < this->nb_nodes)
            );
  }
  if (local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_90.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Dijkstra::run() {
	q = std::priority_queue<tuple, std::vector<tuple>, Dijkstra::Priority>();
	std::vector<bool> vis = std::vector<bool>(nb_nodes, false);

	int count = 0;

	pred = std::vector<int>(nb_nodes, -1);
	has_kids = std::vector<bool>(nb_nodes, false);
	cost = std::vector<int>(nb_nodes, -1);

	pred[source] = source;
	cost[source] = duration(source);
	const tuple initial(source, cost[source]);
	q.push(initial);

	if (verbose) {
		std::cout << "START" << '\n';
	}

	while (!q.empty() && count < nb_nodes) {
		const tuple top = q.top();
		q.pop();
		const int curr = top.node;

		if (vis[curr]) {
			continue;
		}

		on_visiting_node(curr);
		vis[curr] = true;
		count++;

		if (verbose) {
			std::cout << "Visiting " << curr << " from " << pred[curr] << "(cost: " << cost[curr] << ")"
								<< '\n';
		}

		for (unsigned int i = 0; i < out[curr].size(); i++) {
			const int e = out[curr][i];
			assert(en[e][0] == curr);
			if (ignore_edge(e) || weight(e) < 0) {
				if (verbose) {
					std::cout << "Ignoring edge " << e << " from " << en[e][0] << " to " << en[e][1] << '\n';
				}
				on_ignore_edge(e);
				continue;
			}
			const int other = en[e][1];  // Head of e

			if (ignore_node(other)) {
				continue;
			}
			if (vis[other]) {
				continue;
			}

			if (cost[other] == -1 || cost[other] > cost[curr] + weight(e, cost[curr]) + duration(other)) {
				cost[other] = cost[curr] + weight(e, cost[curr]) + duration(other);
				assert(cost[other] != -1);
				pred[other] = curr;
				has_kids[curr] = true;
				if (verbose) {
					std::cout << "Marked " << other << " from " << curr << " of cost " << cost[other] << '\n';
				}
				const tuple new_node(other, cost[other]);
				enqueue(new_node);
			}
		}
	}
}